

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O3

void __thiscall
gui::Signal<gui::Widget_*,_unsigned_long>::emit
          (Signal<gui::Widget_*,_unsigned_long> *this,Widget *funcArgs,unsigned_long funcArgs_1)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  unsigned_long local_40;
  Widget *local_38;
  
  if (this->enabled_ == true) {
    p_Var1 = (this->callbacks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(this->callbacks_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var1 != p_Var2) {
      do {
        if (*(int *)&p_Var1[2]._M_parent == 0) {
          local_40 = funcArgs_1;
          local_38 = funcArgs;
          if (p_Var1[1]._M_right == (_Base_ptr)0x0) goto LAB_0019570f;
          (**(code **)(p_Var1 + 2))(&p_Var1[1]._M_parent,&local_38,&local_40);
        }
        else {
          if (p_Var1[1]._M_right == (_Base_ptr)0x0) {
LAB_0019570f:
            std::__throw_bad_function_call();
          }
          (**(code **)(p_Var1 + 2))();
        }
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
      } while ((_Rb_tree_header *)p_Var1 != p_Var2);
    }
  }
  return;
}

Assistant:

void emit(Targs... funcArgs) const {
        if (!enabled_) {
            return;
        }
        using Tag = typename Callback<Targs...>::Tag;
        for (const auto& c : callbacks_) {
            if (c.second.getTag() == Tag::withArgs) {
                c.second.template value<Tag::withArgs>()(funcArgs...);
            } else {
                c.second.template value<Tag::noArgs>()();
            }
        }
    }